

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_container(lyout *out,int level,lys_node *node)

{
  long lVar1;
  lys_node_container *cont;
  lys_node *sub;
  int content;
  int i;
  lys_node *node_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  sub._0_4_ = 0;
  _content = node;
  node_local._4_4_ = level;
  plStack_10 = out;
  yin_print_open(out,level,(char *)0x0,"container","name",node->name,0);
  node_local._4_4_ = node_local._4_4_ + 1;
  yin_print_snode_common(plStack_10,node_local._4_4_,_content,_content->module,(int *)&sub,1);
  if (node[1].name != (char *)0x0) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_when(plStack_10,node_local._4_4_,_content->module,(lys_when *)node[1].name);
  }
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)node->iffeature_size; sub._4_4_ = sub._4_4_ + 1) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_iffeature(plStack_10,node_local._4_4_,_content->module,node->iffeature + sub._4_4_);
  }
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)node->padding[2]; sub._4_4_ = sub._4_4_ + 1) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_must(plStack_10,node_local._4_4_,_content->module,
                   (lys_restr *)(node[1].dsc + (long)sub._4_4_ * 0x38));
  }
  lVar1._0_2_ = node[1].flags;
  lVar1._2_1_ = node[1].ext_size;
  lVar1._3_1_ = node[1].iffeature_size;
  lVar1._4_1_ = node[1].padding[0];
  lVar1._5_1_ = node[1].padding[1];
  lVar1._6_1_ = node[1].padding[2];
  lVar1._7_1_ = node[1].padding[3];
  if (lVar1 != 0) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_substmt(plStack_10,node_local._4_4_,LYEXT_SUBSTMT_PRESENCE,'\0',
                      *(char **)&node[1].flags,_content->module,_content->ext,
                      (uint)_content->ext_size);
  }
  yin_print_snode_common(plStack_10,node_local._4_4_,_content,_content->module,(int *)&sub,0x74);
  for (sub._4_4_ = 0; sub._4_4_ < (int)(uint)node->padding[3]; sub._4_4_ = sub._4_4_ + 1) {
    yin_print_close_parent(plStack_10,(int *)&sub);
    yin_print_typedef(plStack_10,node_local._4_4_,_content->module,
                      (lys_tpdf *)(node[1].ref + (long)sub._4_4_ * 0x80));
  }
  for (cont = (lys_node_container *)_content->child; cont != (lys_node_container *)0x0;
      cont = (lys_node_container *)cont->next) {
    if (cont->parent == _content) {
      yin_print_close_parent(plStack_10,(int *)&sub);
      yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)cont,0x800);
    }
  }
  for (cont = (lys_node_container *)_content->child; cont != (lys_node_container *)0x0;
      cont = (lys_node_container *)cont->next) {
    if (cont->parent == _content) {
      yin_print_close_parent(plStack_10,(int *)&sub);
      yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)cont,0x903f);
    }
  }
  for (cont = (lys_node_container *)_content->child; cont != (lys_node_container *)0x0;
      cont = (lys_node_container *)cont->next) {
    if (cont->parent == _content) {
      yin_print_close_parent(plStack_10,(int *)&sub);
      yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)cont,0x4000);
    }
  }
  for (cont = (lys_node_container *)_content->child; cont != (lys_node_container *)0x0;
      cont = (lys_node_container *)cont->next) {
    if (cont->parent == _content) {
      yin_print_close_parent(plStack_10,(int *)&sub);
      yin_print_snode(plStack_10,node_local._4_4_,(lys_node *)cont,0x80);
    }
  }
  node_local._4_4_ = node_local._4_4_ + -1;
  yin_print_close(plStack_10,node_local._4_4_,(char *)0x0,"container",(int)sub);
  return;
}

Assistant:

static void
yin_print_container(struct lyout *out, int level, const struct lys_node *node)
{
    int i, content = 0;
    struct lys_node *sub;
    struct lys_node_container *cont = (struct lys_node_container *)node;

    yin_print_open(out, level, NULL, "container", "name", node->name, content);
    level++;

    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_EXT);
    if (cont->when) {
        yin_print_close_parent(out, &content);
        yin_print_when(out, level, node->module, cont->when);
    }

    for (i = 0; i < cont->iffeature_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_iffeature(out, level, node->module, &cont->iffeature[i]);
    }

    for (i = 0; i < cont->must_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_must(out, level, node->module, &cont->must[i]);
    }

    if (cont->presence) {
        yin_print_close_parent(out, &content);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_PRESENCE, 0, cont->presence,
                          node->module, node->ext, node->ext_size);
    }
    yin_print_snode_common(out, level, node, node->module, &content, SNODE_COMMON_CONFIG |
                           SNODE_COMMON_STATUS | SNODE_COMMON_DSC | SNODE_COMMON_REF);

    for (i = 0; i < cont->tpdf_size; i++) {
        yin_print_close_parent(out, &content);
        yin_print_typedef(out, level, node->module, &cont->tpdf[i]);
    }

    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_GROUPING);
    }
    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_CHOICE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST |
                         LYS_USES | LYS_ANYDATA );
    }
    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_ACTION);
    }
    LY_TREE_FOR(node->child, sub) {
        /* augments */
        if (sub->parent != node) {
            continue;
        }
        yin_print_close_parent(out, &content);
        yin_print_snode(out, level, sub, LYS_NOTIF);
    }

    level--;
    yin_print_close(out, level, NULL, "container", content);
}